

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

upb_MapInsertStatus
upb_Map_Insert(upb_Map *map,upb_MessageValue key,upb_MessageValue val,upb_Arena *arena)

{
  char cVar1;
  uintptr_t key_00;
  _Bool _Var2;
  _Bool _Var3;
  size_t len;
  upb_MapInsertStatus uVar4;
  upb_MessageValue *key_01;
  upb_value local_60;
  upb_MessageValue key_local;
  upb_MessageValue val_local;
  uintptr_t intkey;
  
  val_local.str_val.size = val.str_val.size;
  val_local.int64_val = val._0_8_;
  len = key.str_val.size;
  key_01 = (upb_MessageValue *)key.str_val.data;
  key_local.str_val.data = (char *)key_01;
  key_local.str_val.size = len;
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/map.c"
                  ,0x46,
                  "upb_MapInsertStatus upb_Map_Insert(upb_Map *, upb_MessageValue, upb_MessageValue, upb_Arena *)"
                 );
  }
  if (map->is_frozen_dont_copy_me__upb_internal_use_only != true) {
    cVar1 = map->key_size;
    local_60.val = 0;
    _Var2 = _upb_map_tovalue(&val_local,(long)map->val_size,&local_60,arena);
    uVar4 = kUpb_MapInsertStatus_OutOfMemory;
    if (_Var2) {
      if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
        if (cVar1 != '\0') {
          len = (long)cVar1;
          key_01 = &key_local;
        }
        _Var2 = upb_strtable_remove2
                          (&(map->t).strtable,(char *)&key_01->int32_val,len,(upb_value *)0x0);
        _Var3 = upb_strtable_insert(&(map->t).strtable,(char *)&key_01->int32_val,len,local_60,arena
                                   );
      }
      else {
        intkey = 0;
        memcpy(&intkey,&key_local,(long)cVar1);
        key_00 = intkey;
        _Var2 = upb_inttable_remove(&(map->t).inttable,intkey,(upb_value *)0x0);
        _Var3 = upb_inttable_insert(&(map->t).inttable,key_00,local_60,arena);
      }
      uVar4 = kUpb_MapInsertStatus_OutOfMemory;
      if (_Var3 != false) {
        uVar4 = (upb_MapInsertStatus)_Var2;
      }
    }
    return uVar4;
  }
  __assert_fail("!upb_Map_IsFrozen(map)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/map.h"
                ,0xb0,
                "upb_MapInsertStatus _upb_Map_Insert(struct upb_Map *, const void *, size_t, void *, size_t, upb_Arena *)"
               );
}

Assistant:

UPB_INLINE upb_MapInsertStatus _upb_Map_Insert(struct upb_Map* map,
                                               const void* key, size_t key_size,
                                               void* val, size_t val_size,
                                               upb_Arena* a) {
  UPB_ASSERT(!upb_Map_IsFrozen(map));

  // Prep the value.
  upb_value tabval = {0};
  if (!_upb_map_tovalue(val, val_size, &tabval, a)) {
    return kUpb_MapInsertStatus_OutOfMemory;
  }

  bool removed;
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_StringView strkey = _upb_map_tokey(key, key_size);
    // TODO: add overwrite operation to minimize number of lookups.
    removed =
        upb_strtable_remove2(&map->t.strtable, strkey.data, strkey.size, NULL);
    if (!upb_strtable_insert(&map->t.strtable, strkey.data, strkey.size, tabval,
                             a)) {
      return kUpb_MapInsertStatus_OutOfMemory;
    }
  } else {
    uintptr_t intkey = _upb_map_tointkey(key, key_size);
    removed = upb_inttable_remove(&map->t.inttable, intkey, NULL);
    if (!upb_inttable_insert(&map->t.inttable, intkey, tabval, a)) {
      return kUpb_MapInsertStatus_OutOfMemory;
    }
  }
  return removed ? kUpb_MapInsertStatus_Replaced
                 : kUpb_MapInsertStatus_Inserted;
}